

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::bt_peer_connection::on_hashes(bt_peer_connection *this,int received)

{
  _Atomic_word *p_Var1;
  crypto_receive_buffer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *this_01;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar6;
  char *pcVar7;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  _Var8;
  long lVar9;
  long lVar10;
  uint blocks;
  torrent *this_02;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> sVar11;
  uint uVar12;
  int iVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  file_index_t i;
  file_index_t index;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  span<const_char> sVar17;
  span<libtorrent::digest32<256L>_> hashes_00;
  char *local_d0;
  int local_c4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> hashes;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  hash_request hr;
  sha256_hash file_root;
  error_code local_40;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar3 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])(this);
  if ((*(byte *)(CONCAT44(extraout_var,iVar3) + 0x1f) & 1) == 0) {
    file_root.m_number._M_elems._0_16_ = errors::make_error_code(invalid_message);
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,&file_root,1,2);
  }
  else {
    p_Var2 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this_02 = (torrent *)0x0;
      this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this_02 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
      }
      iVar3 = p_Var2->_M_use_count;
      do {
        if (iVar3 == 0) {
          this_02 = (torrent *)0x0;
          this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          goto LAB_0018b5f3;
        }
        LOCK();
        iVar4 = p_Var2->_M_use_count;
        bVar14 = iVar3 == iVar4;
        if (bVar14) {
          p_Var2->_M_use_count = iVar3 + 1;
          iVar4 = iVar3;
        }
        iVar3 = iVar4;
        UNLOCK();
      } while (!bVar14);
      this_03 = p_Var2;
      if (p_Var2->_M_use_count == 0) {
        this_02 = (torrent *)0x0;
      }
LAB_0018b5f3:
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var2->_M_weak_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = p_Var2->_M_weak_count;
        p_Var2->_M_weak_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*p_Var2->_vptr__Sp_counted_base[3])();
      }
    }
    this_01 = (this_02->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = &this->m_recv_buffer;
    sVar17 = crypto_receive_buffer::get(this_00);
    lVar9 = sVar17.m_len;
    pcVar5 = sVar17.m_ptr;
    if (0x30 < lVar9) {
      file_root.m_number._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar5 + 1);
      file_root.m_number._M_elems._16_8_ = *(undefined8 *)(pcVar5 + 0x11);
      file_root.m_number._M_elems._24_8_ = *(undefined8 *)(pcVar5 + 0x19);
      iVar6 = file_storage::file_range(&this_01->m_files);
      local_c4 = -1;
      sVar11 = iVar6._end.m_val;
      index.m_val = local_c4;
      local_c0 = this_03;
      if (iVar6._begin.m_val.m_val != sVar11.m_val) {
        do {
          index.m_val = (int)iVar6._begin.m_val;
          file_storage::root((sha256_hash *)&hashes,&this_01->m_files,index);
          auVar16[0] = -((char)hashes.
                               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage ==
                        (char)file_root.m_number._M_elems[4]);
          auVar16[1] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ ==
                        file_root.m_number._M_elems[4]._1_1_);
          auVar16[2] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ ==
                        file_root.m_number._M_elems[4]._2_1_);
          auVar16[3] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ ==
                        file_root.m_number._M_elems[4]._3_1_);
          auVar16[4] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ ==
                        (char)file_root.m_number._M_elems[5]);
          auVar16[5] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ ==
                        file_root.m_number._M_elems[5]._1_1_);
          auVar16[6] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ==
                        file_root.m_number._M_elems[5]._2_1_);
          auVar16[7] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ==
                        file_root.m_number._M_elems[5]._3_1_);
          auVar16[8] = -(cStack_a0 == (char)file_root.m_number._M_elems[6]);
          auVar16[9] = -(cStack_9f == file_root.m_number._M_elems[6]._1_1_);
          auVar16[10] = -(cStack_9e == file_root.m_number._M_elems[6]._2_1_);
          auVar16[0xb] = -(cStack_9d == file_root.m_number._M_elems[6]._3_1_);
          auVar16[0xc] = -(cStack_9c == (char)file_root.m_number._M_elems[7]);
          auVar16[0xd] = -(cStack_9b == file_root.m_number._M_elems[7]._1_1_);
          auVar16[0xe] = -(cStack_9a == file_root.m_number._M_elems[7]._2_1_);
          auVar16[0xf] = -(cStack_99 == file_root.m_number._M_elems[7]._3_1_);
          auVar15[0] = -((char)hashes.
                               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                               ._M_impl.super__Vector_impl_data._M_start ==
                        (char)file_root.m_number._M_elems[0]);
          auVar15[1] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_1_ ==
                        file_root.m_number._M_elems[0]._1_1_);
          auVar15[2] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._2_1_ ==
                        file_root.m_number._M_elems[0]._2_1_);
          auVar15[3] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._3_1_ ==
                        file_root.m_number._M_elems[0]._3_1_);
          auVar15[4] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_1_ ==
                        (char)file_root.m_number._M_elems[1]);
          auVar15[5] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._5_1_ ==
                        file_root.m_number._M_elems[1]._1_1_);
          auVar15[6] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._6_1_ ==
                        file_root.m_number._M_elems[1]._2_1_);
          auVar15[7] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._7_1_ ==
                        file_root.m_number._M_elems[1]._3_1_);
          auVar15[8] = -((char)hashes.
                               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish ==
                        (char)file_root.m_number._M_elems[2]);
          auVar15[9] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_1_ ==
                        file_root.m_number._M_elems[2]._1_1_);
          auVar15[10] = -(hashes.
                          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._2_1_ ==
                         file_root.m_number._M_elems[2]._2_1_);
          auVar15[0xb] = -(hashes.
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                          file_root.m_number._M_elems[2]._3_1_);
          auVar15[0xc] = -(hashes.
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                          (char)file_root.m_number._M_elems[3]);
          auVar15[0xd] = -(hashes.
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                          file_root.m_number._M_elems[3]._1_1_);
          auVar15[0xe] = -(hashes.
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                          file_root.m_number._M_elems[3]._2_1_);
          auVar15[0xf] = -(hashes.
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                          file_root.m_number._M_elems[3]._3_1_);
          auVar15 = auVar15 & auVar16;
          if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) break;
          iVar6._begin.m_val = index.m_val + 1;
          iVar6._end.m_val = 0;
          index.m_val = local_c4;
        } while (sVar11.m_val != iVar6._begin.m_val);
      }
      local_c4 = index.m_val;
      pcVar7 = pcVar5 + 0x22;
      lVar10 = 0;
      hr.base = 0;
      do {
        hr.base = (uint)(byte)pcVar7[-1] | hr.base << 8;
        pcVar7 = pcVar7 + 1;
        lVar10 = lVar10 + 1;
      } while ((int)lVar10 != 4);
      lVar10 = (lVar9 - lVar10) + -0x21;
      hr.index = 0;
      iVar3 = 4;
      do {
        hr.index = (uint)(byte)pcVar7[-1] | hr.index << 8;
        lVar10 = lVar10 + -1;
        pcVar7 = pcVar7 + 1;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      blocks = 0;
      iVar3 = 4;
      do {
        blocks = (uint)(byte)pcVar7[-1] | blocks << 8;
        pcVar7 = pcVar7 + 1;
        lVar10 = lVar10 + -1;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      uVar12 = 0;
      iVar3 = 4;
      do {
        local_d0 = pcVar7;
        uVar12 = (uint)(byte)local_d0[-1] | uVar12 << 8;
        lVar10 = lVar10 + -1;
        iVar3 = iVar3 + -1;
        pcVar7 = local_d0 + 1;
      } while (iVar3 != 0);
      hr.file.m_val = local_c4;
      hr.count = blocks;
      hr.proof_layers = uVar12;
      bVar14 = validate_hash_request
                         (&hr,&((this_02->super_torrent_hot_members).m_torrent_file.
                                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_files);
      if (bVar14) {
        iVar3 = merkle_num_leafs(blocks);
        iVar3 = merkle_num_layers(iVar3);
        iVar4 = crypto_receive_buffer::packet_size(this_00);
        iVar13 = (uVar12 - iVar3) + 1;
        iVar3 = 0;
        if (0 < iVar13) {
          iVar3 = iVar13;
        }
        if (iVar4 == (iVar3 + blocks) * 0x20 + 0x31) {
          bVar14 = crypto_receive_buffer::packet_finished(this_00);
          this_03 = local_c0;
          if (bVar14) {
            _Var8 = ::std::
                    __remove_if<__gnu_cxx::__normal_iterator<libtorrent::aux::hash_request*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::hash_request_const>>
                              ((this->m_hash_requests).
                               super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (this->m_hash_requests).
                               super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                               ._M_impl.super__Vector_impl_data._M_finish,&hr);
            if (_Var8._M_current !=
                (this->m_hash_requests).
                super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              (this->m_hash_requests).
              super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
              ._M_impl.super__Vector_impl_data._M_finish = _Var8._M_current;
            }
            hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (lVar10 != 0) {
              do {
                ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>
                ::emplace_back<char_const*&>
                          ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>
                            *)&hashes,&local_d0);
                local_d0 = local_d0 + 0x20;
              } while (local_d0 != pcVar5 + lVar9);
            }
            bVar14 = peer_connection::should_log(&this->super_peer_connection,incoming_message);
            if (bVar14) {
              peer_connection::peer_log
                        (&this->super_peer_connection,incoming_message,"HASHES",
                         "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)(uint)hr.file.m_val,
                         (ulong)(uint)hr.base,(ulong)(uint)hr.index,(ulong)(uint)hr.count,
                         (ulong)(uint)hr.proof_layers);
            }
            hashes_00.m_len =
                 (long)hashes.
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)hashes.
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
            hashes_00.m_ptr =
                 hashes.
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            bVar14 = torrent::add_hashes(this_02,&hr,hashes_00);
            if (bVar14) {
              maybe_send_hash_request(this);
            }
            else {
              local_40 = errors::make_error_code(invalid_hashes);
              (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                        (this,&local_40,1,2);
            }
            this_03 = local_c0;
            if (hashes.
                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(hashes.
                              super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)hashes.
                                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)hashes.
                                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
              this_03 = local_c0;
            }
          }
        }
        else {
          hashes.
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._0_16_ = errors::make_error_code(invalid_hashes);
          (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                    (this,&hashes,1,2);
          this_03 = local_c0;
        }
      }
      else {
        hashes.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._0_16_ = errors::make_error_code(invalid_hashes);
        (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                  (this,&hashes,1,2);
        this_03 = local_c0;
      }
    }
    if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
    }
  }
  return;
}

Assistant:

void bt_peer_connection::on_hashes(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);

		if (!peer_info_struct()->protocol_v2)
		{
			disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
			return;
		}

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		auto const& files = t->torrent_file().files();

		span<char const> recv_buffer = m_recv_buffer.get();

		int const header_size = 1 + 32 + 4 + 4 + 4 + 4;

		if (recv_buffer.size() < header_size)
		{
			return;
		}

		const char* ptr = recv_buffer.begin() + 1;

		auto const file_root = sha256_hash(ptr);
		file_index_t file_index{ -1 };
		for (file_index_t i : files.file_range())
		{
			if (files.root(i) == file_root)
			{
				file_index = i;
				break;
			}
		}
		ptr += sha256_hash::size();
		int const base = aux::read_int32(ptr);
		int const index = aux::read_int32(ptr);
		int const count = aux::read_int32(ptr);
		int const proof_layers = aux::read_int32(ptr);

		hash_request const hr(file_index, base, index, count, proof_layers);

		if (!validate_hash_request(hr, t->torrent_file().files()))
		{
			disconnect(errors::invalid_hashes, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}

		// subtract one because the the base layer doesn't count
		int const proof_hashes = std::max(0
			, proof_layers - (merkle_num_layers(merkle_num_leafs(count)) - 1));

		if (m_recv_buffer.packet_size() != header_size
			+ (count + proof_hashes) * int(sha256_hash::size()))
		{
			disconnect(errors::invalid_hashes, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}

		if (!m_recv_buffer.packet_finished()) return;

		auto new_end = std::remove(m_hash_requests.begin(), m_hash_requests.end(), hr);
		m_hash_requests.erase(new_end, m_hash_requests.end());

		std::vector<sha256_hash> hashes;
		while (ptr != recv_buffer.end())
		{
			hashes.emplace_back(ptr);
			ptr += sha256_hash::size();
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming_message))
		{
			peer_log(peer_log_alert::incoming_message, "HASHES"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(hr.file), hr.base, hr.index, hr.count, hr.proof_layers);
		}
#endif

		if (!t->add_hashes(hr, hashes))
		{
			disconnect(errors::invalid_hashes, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}

		maybe_send_hash_request();
	}